

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenStringSliceIterSetRef(BinaryenExpressionRef expr,BinaryenExpressionRef refExpr)

{
  if (expr->_id != StringSliceIterId) {
    __assert_fail("expression->is<StringSliceIter>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1325,
                  "void BinaryenStringSliceIterSetRef(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (refExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = refExpr;
    return;
  }
  __assert_fail("refExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1326,
                "void BinaryenStringSliceIterSetRef(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringSliceIterSetRef(BinaryenExpressionRef expr,
                                   BinaryenExpressionRef refExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringSliceIter>());
  assert(refExpr);
  static_cast<StringSliceIter*>(expression)->ref = (Expression*)refExpr;
}